

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer puVar1;
  ByteSequence result;
  ByteSequence input;
  uint8_t in [19];
  ByteSequence local_78;
  void *local_60 [3];
  uchar local_48 [32];
  ByteSequence local_28;
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\n';
  local_48[4] = '\x14';
  local_48[5] = '\0';
  local_48[6] = '(';
  local_48[7] = '\0';
  local_48[8] = '<';
  local_48[9] = 'F';
  local_48[10] = 'P';
  local_48[0xb] = 'Z';
  local_48[0xc] = 'd';
  local_48[0xd] = 'n';
  local_48[0xe] = '\0';
  local_48[0xf] = 0x82;
  local_48[0x10] = '\0';
  local_48[0x11] = 0x96;
  local_48[0x12] = 0xa0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_60,local_48,
             local_48 + 0x13,(allocator_type *)&local_28);
  cobs::cobs_encode(&local_78,(ByteSequence *)local_60);
  puVar1 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  cobs::cobs_decode(&local_78,&local_28);
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  if (local_60[0] != (void *)0x0) {
    operator_delete(local_60[0]);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{


  int rc= 0;
  const int DATASIZE = 19;

  uint8_t in[] = {0,0,0,10,20,0,40,0,60,70,80,90,100,110,0,130,0,150,160};
  uint8_t out[DATASIZE + 1 + DATASIZE / 254];

  
  cobs::ByteSequence input( in, in+DATASIZE);
  cobs::ByteSequence output;

  output =	cobs::cobs_encode(input);
  cobs::ByteSequence result = cobs::cobs_decode(output);

 size_t written =  cobs_encode(in, DATASIZE, out);
  
  return(rc);


}